

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v9::detail::format_uint<1u,char,fmt::v9::appender,unsigned__int128>
                   (appender out,unsigned___int128 value,int num_digits,bool upper)

{
  undefined1 value_00 [16];
  undefined1 value_01 [16];
  char *buffer_00;
  bool in_DL;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> in_RSI;
  buffer<char> *in_RDI;
  char buffer [129];
  char *ptr;
  char *in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  size_t in_stack_ffffffffffffff00;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> in_stack_ffffffffffffff08;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_8;
  
  to_unsigned<int>(0);
  buffer_00 = to_pointer<char>((buffer_appender<char>)in_stack_ffffffffffffff08.container,
                               in_stack_ffffffffffffff00);
  if (buffer_00 == (char *)0x0) {
    value_01._8_8_ = in_stack_fffffffffffffef0;
    value_01._0_8_ = in_stack_fffffffffffffee8;
    format_uint<1u,char,unsigned__int128>
              (&stack0xffffffffffffff08,(unsigned___int128)value_01,(int)in_RSI.container,in_DL);
    local_8.container =
         (buffer<char> *)
         copy_str_noinline<char,char*,fmt::v9::appender>
                   (in_RDI,in_stack_fffffffffffffee8,in_RSI.container);
  }
  else {
    value_00._8_8_ = in_stack_fffffffffffffef0;
    value_00._0_8_ = in_stack_fffffffffffffee8;
    format_uint<1u,char,unsigned__int128>
              (buffer_00,(unsigned___int128)value_00,(int)in_RSI.container,in_DL);
    local_8.container = in_RDI;
  }
  return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)local_8.container;
}

Assistant:

inline auto format_uint(It out, UInt value, int num_digits, bool upper = false)
    -> It {
  if (auto ptr = to_pointer<Char>(out, to_unsigned(num_digits))) {
    format_uint<BASE_BITS>(ptr, value, num_digits, upper);
    return out;
  }
  // Buffer should be large enough to hold all digits (digits / BASE_BITS + 1).
  char buffer[num_bits<UInt>() / BASE_BITS + 1];
  format_uint<BASE_BITS>(buffer, value, num_digits, upper);
  return detail::copy_str_noinline<Char>(buffer, buffer + num_digits, out);
}